

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.h
# Opt level: O1

void __thiscall
wallet::PreSelectedInputs::Insert(PreSelectedInputs *this,COutput *output,bool subtract_fee_outputs)

{
  COutput *pCVar1;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  shared_ptr<wallet::COutput> local_30;
  undefined1 local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000011,subtract_fee_outputs) == 0) {
    pCVar1 = output;
    if ((output->effective_value).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      __assert_fail("effective_value.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/coinselection.h"
                    ,0x82,"CAmount wallet::COutput::GetEffectiveValue() const");
    }
  }
  else {
    pCVar1 = (COutput *)&output->txout;
  }
  this->total_amount =
       this->total_amount +
       (pCVar1->effective_value).super__Optional_base<long,_true,_true>._M_payload.
       super__Optional_payload_base<long>._M_payload._M_value;
  local_30.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::COutput,std::allocator<wallet::COutput>,wallet::COutput_const&>
            (&local_30.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (COutput **)&local_30,(allocator<wallet::COutput> *)&local_19,output);
  std::
  _Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
  ::_M_insert_unique<std::shared_ptr<wallet::COutput>>
            ((_Rb_tree<std::shared_ptr<wallet::COutput>,std::shared_ptr<wallet::COutput>,std::_Identity<std::shared_ptr<wallet::COutput>>,std::less<std::shared_ptr<wallet::COutput>>,std::allocator<std::shared_ptr<wallet::COutput>>>
              *)this,&local_30);
  if (local_30.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<wallet::COutput,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Insert(const COutput& output, bool subtract_fee_outputs)
    {
        if (subtract_fee_outputs) {
            total_amount += output.txout.nValue;
        } else {
            total_amount += output.GetEffectiveValue();
        }
        coins.insert(std::make_shared<COutput>(output));
    }